

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_dirhie.c
# Opt level: O3

CURLcode create_dir_hierarchy(char *outfile,FILE *errors)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *__s_00;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  size_t sVar8;
  CURLcode CVar9;
  
  sVar2 = strlen(outfile);
  __s = strdup(outfile);
  CVar9 = CURLE_OUT_OF_MEMORY;
  if (__s != (char *)0x0) {
    __s_00 = (char *)malloc(sVar2 + 1);
    if (__s_00 != (char *)0x0) {
      *__s_00 = '\0';
      pcVar3 = strtok(__s,"/");
      if (pcVar3 == (char *)0x0) {
        CVar9 = CURLE_OK;
      }
      else {
        pcVar4 = strtok((char *)0x0,"/");
        while (pcVar5 = pcVar4, CVar9 = CURLE_OK, pcVar5 != (char *)0x0) {
          sVar6 = strlen(__s_00);
          if (sVar6 == 0) {
            sVar8 = sVar2;
            pcVar4 = __s_00;
            if (__s != pcVar3) goto LAB_0010d07c;
            strcpy(__s_00,pcVar3);
          }
          else {
            sVar8 = sVar2 - sVar6;
            pcVar4 = __s_00 + sVar6;
LAB_0010d07c:
            curl_msnprintf(pcVar4,sVar8,"%s%s","/",pcVar3);
          }
          iVar1 = mkdir(__s_00,0x1e8);
          if (iVar1 == -1) {
            piVar7 = __errno_location();
            iVar1 = *piVar7;
            if (iVar1 != 0x11) {
              if (iVar1 < 0x1e) {
                if (iVar1 == 0xd) {
                  pcVar3 = "You don\'t have permission to create %s.\n";
                }
                else if (iVar1 == 0x1c) {
                  pcVar3 = "No space left on the file system that will contain the directory %s.\n";
                }
                else {
LAB_0010d12a:
                  pcVar3 = "Error creating directory %s.\n";
                }
              }
              else if (iVar1 == 0x1e) {
                pcVar3 = "%s resides on a read-only file system.\n";
              }
              else if (iVar1 == 0x24) {
                pcVar3 = "The directory name %s is too long.\n";
              }
              else {
                if (iVar1 != 0x7a) goto LAB_0010d12a;
                pcVar3 = "Cannot create directory %s because you exceeded your quota.\n";
              }
              curl_mfprintf(errors,pcVar3,__s_00);
              CVar9 = CURLE_WRITE_ERROR;
              break;
            }
          }
          pcVar4 = strtok((char *)0x0,"/");
          pcVar3 = pcVar5;
        }
      }
      free(__s_00);
    }
    free(__s);
  }
  return CVar9;
}

Assistant:

CURLcode create_dir_hierarchy(const char *outfile, FILE *errors)
{
  char *tempdir;
  char *tempdir2;
  char *outdup;
  char *dirbuildup;
  CURLcode result = CURLE_OK;
  size_t outlen;

  outlen = strlen(outfile);
  outdup = strdup(outfile);
  if(!outdup)
    return CURLE_OUT_OF_MEMORY;

  dirbuildup = malloc(outlen + 1);
  if(!dirbuildup) {
    Curl_safefree(outdup);
    return CURLE_OUT_OF_MEMORY;
  }
  dirbuildup[0] = '\0';

  /* Allow strtok() here since this isn't used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  tempdir = strtok(outdup, PATH_DELIMITERS);

  while(tempdir != NULL) {
    tempdir2 = strtok(NULL, PATH_DELIMITERS);
    /* since strtok returns a token for the last word even
       if not ending with DIR_CHAR, we need to prune it */
    if(tempdir2 != NULL) {
      size_t dlen = strlen(dirbuildup);
      if(dlen)
        msnprintf(&dirbuildup[dlen], outlen - dlen, "%s%s", DIR_CHAR, tempdir);
      else {
        if(outdup == tempdir)
          /* the output string doesn't start with a separator */
          strcpy(dirbuildup, tempdir);
        else
          msnprintf(dirbuildup, outlen, "%s%s", DIR_CHAR, tempdir);
      }
      if((-1 == mkdir(dirbuildup, (mode_t)0000750)) && (errno != EEXIST)) {
        show_dir_errno(errors, dirbuildup);
        result = CURLE_WRITE_ERROR;
        break; /* get out of loop */
      }
    }
    tempdir = tempdir2;
  }

  Curl_safefree(dirbuildup);
  Curl_safefree(outdup);

  return result;
}